

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::AddressTest_AddressFromString_Ipv6Prefix_Test::
~AddressTest_AddressFromString_Ipv6Prefix_Test(AddressTest_AddressFromString_Ipv6Prefix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AddressTest, AddressFromString_Ipv6Prefix)
{
    Address addr;

    const static std::string kPrefix = "2001:db8:3c4d:15::";
    EXPECT_EQ(addr.Set(kPrefix), ErrorCode::kNone);
    EXPECT_TRUE(addr.IsValid());
    EXPECT_TRUE(addr.IsIpv6());

    EXPECT_EQ(addr.ToString(), kPrefix);
}